

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O0

UserSet * __thiscall wasm::DataFlow::Users::getUsers(Users *this,Node *node)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
  local_28;
  iterator iter;
  Node *node_local;
  Users *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false>
               )node;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::DataFlow::Node_*,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
       ::find(&this->users,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::DataFlow::Node_*,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
       ::end(&this->users);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    if (getUsers(wasm::DataFlow::Node*)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&getUsers(wasm::DataFlow::Node*)::empty);
      if (iVar2 != 0) {
        std::
        unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
        ::unordered_set(&getUsers::empty);
        __cxa_atexit(std::
                     unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                     ::~unordered_set,&getUsers::empty,&__dso_handle);
        __cxa_guard_release(&getUsers(wasm::DataFlow::Node*)::empty);
      }
    }
    this_local = (Users *)&getUsers::empty;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_false,_false>
                           *)&local_28);
    this_local = (Users *)&ppVar3->second;
  }
  return (UserSet *)this_local;
}

Assistant:

UserSet& getUsers(Node* node) {
    auto iter = users.find(node);
    if (iter == users.end()) {
      static UserSet empty; // FIXME thread_local?
      return empty;
    }
    return iter->second;
  }